

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

float ImGui::CalcWrapWidthForPos(ImVec2 *pos,float wrap_pos_x)

{
  ImGuiWindow *pIVar1;
  ImVec2 IVar2;
  float fVar3;
  
  fVar3 = 0.0;
  if (0.0 <= wrap_pos_x) {
    pIVar1 = GImGui->CurrentWindow;
    if ((wrap_pos_x != 0.0) || (NAN(wrap_pos_x))) {
      if (0.0 < wrap_pos_x) {
        wrap_pos_x = wrap_pos_x + ((pIVar1->Pos).x - (pIVar1->Scroll).x);
      }
    }
    else {
      IVar2 = GetContentRegionMax();
      wrap_pos_x = IVar2.x + (pIVar1->Pos).x;
    }
    fVar3 = wrap_pos_x - pos->x;
    if (fVar3 <= 1.0) {
      fVar3 = 1.0;
    }
  }
  return fVar3;
}

Assistant:

float ImGui::CalcWrapWidthForPos(const ImVec2& pos, float wrap_pos_x)
{
    if (wrap_pos_x < 0.0f)
        return 0.0f;

    ImGuiWindow* window = GetCurrentWindowRead();
    if (wrap_pos_x == 0.0f)
        wrap_pos_x = GetContentRegionMax().x + window->Pos.x;
    else if (wrap_pos_x > 0.0f)
        wrap_pos_x += window->Pos.x - window->Scroll.x; // wrap_pos_x is provided is window local space

    return ImMax(wrap_pos_x - pos.x, 1.0f);
}